

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
despot::Parser::PrintState(Parser *this,vector<int,_std::allocator<int>_> *state,ostream *out)

{
  int iVar1;
  pointer pSVar2;
  long lVar3;
  ostream *poVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
  if ((state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      pcVar6 = ", ";
      if (lVar7 == 0) {
        pcVar6 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar6,(ulong)((uint)(lVar7 != 0) * 2))
      ;
      pSVar2 = (this->curr_state_vars_).
               super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,*(char **)((long)&(pSVar2->super_NamedVar).name_._M_dataplus + lVar7),
                          *(long *)((long)&(pSVar2->super_NamedVar).name_._M_string_length + lVar7))
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
      iVar1 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_start[uVar5];
      pSVar2 = (this->curr_state_vars_).
               super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = *(long *)((long)&(pSVar2->super_NamedVar).super_Variable.values_ + lVar7);
      if (iVar1 < (int)((ulong)(*(long *)((long)&(pSVar2->super_NamedVar).super_Variable.values_ +
                                         lVar7 + 8U) - lVar3) >> 5)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,*(char **)(lVar3 + (long)iVar1 * 0x20),
                   *(long *)(lVar3 + 8 + (long)iVar1 * 0x20));
      }
      else {
        std::ostream::operator<<(out,iVar1);
      }
      uVar5 = uVar5 + 1;
      lVar7 = lVar7 + 0xc0;
    } while (uVar5 < (ulong)((long)(state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"]",1);
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  return;
}

Assistant:

void Parser::PrintState(const vector<int>& state, ostream& out) const {
	out << "[";
	for (int s = 0; s < state.size(); s++) {
		out << (s == 0 ? "" : ", ") << curr_state_vars_[s].name() << ":";
		if (state[s] >= curr_state_vars_[s].Size()) {
			// allow POMDPX::current_->PrintState to work in POMDPXState::text when 
			// state is not defined in current_, but the names of the state
			// components are defined
			out << state[s];
		} else {
			out << curr_state_vars_[s].GetValue(state[s]);
		}
	}
	out << "]" << endl;
}